

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
CS248::DynamicScene::XFormWidget::draw_pick(XFormWidget *this,int *pickID,bool transformed)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int iVar1;
  int i;
  mapped_type *pmVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_01;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  XFormWidget *in_stack_00000030;
  XFormWidget *in_stack_000000c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ccolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Zcolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ycolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Xcolor;
  XFormWidget *in_stack_00000310;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  size_type in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb0;
  key_type_conflict *in_stack_fffffffffffffec8;
  map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
  *in_stack_fffffffffffffed0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_71 [49];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  int *local_10;
  
  local_11 = in_DL & 1;
  if (*(long *)(in_RDI + 0xf0) != 0) {
    this_02 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x128);
    local_18 = *in_RSI;
    local_10 = in_RSI;
    pmVar2 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    *pmVar2 = X;
    local_1c = *local_10 + 1;
    pmVar2 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    *pmVar2 = Y;
    local_20 = *local_10 + 2;
    pmVar2 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    *pmVar2 = Z;
    local_24 = *local_10 + 3;
    pmVar2 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    *pmVar2 = Center;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x20bc7d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x20bca6);
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_71;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x20bcbb);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x20bce4);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x20bcf9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x20bd22);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x20bd37);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x20bd60);
    iVar1 = *local_10;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,1);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,2);
    IndexToRGB(iVar1,pvVar3,pvVar4,pvVar5);
    iVar1 = *local_10;
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_71 + 1);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,1);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,2);
    IndexToRGB(iVar1 + 1,pvVar3,pvVar4,pvVar5);
    iVar1 = *local_10;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_90,0);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_90,1);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_90,2);
    IndexToRGB(iVar1 + 2,pvVar3,pvVar4,pvVar5);
    i = *local_10 + 3;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b0,0);
    this_01 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b0,1)
    ;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b0,2);
    IndexToRGB(i,pvVar3,(uchar *)this_01,pvVar4);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_b0,3);
    *pvVar4 = '@';
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_90,3);
    *pvVar4 = '@';
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_71 + 1),3);
    *pvVar4 = '@';
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,3);
    *pvVar4 = '@';
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_01,(size_type)pvVar3);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(in_RDI + 0x200),0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_02,__x);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(in_RDI + 0x200),1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_02,__x);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(in_RDI + 0x200),2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_02,__x);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(in_RDI + 0x200),3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_02,__x);
    glPushMatrix();
    iVar1 = *(int *)(in_RDI + 0x120);
    if (iVar1 == 0) {
      drawTranslateHandles(in_stack_000000c0);
    }
    else if (iVar1 == 1) {
      drawRotateHandles(in_stack_00000030);
    }
    else if (iVar1 == 2) {
      drawScaleHandles(in_stack_00000310);
    }
    glPopMatrix();
    *local_10 = *local_10 + 4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(i,in_stack_fffffffffffffea0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(i,in_stack_fffffffffffffea0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(i,in_stack_fffffffffffffea0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(i,in_stack_fffffffffffffea0));
  }
  return;
}

Assistant:

void XFormWidget::draw_pick(int& pickID, bool transformed) {
  if (target.object == nullptr) return;

  pickIDToAxis[pickID + 0] = Selection::Axis::X;
  pickIDToAxis[pickID + 1] = Selection::Axis::Y;
  pickIDToAxis[pickID + 2] = Selection::Axis::Z;
  pickIDToAxis[pickID + 3] = Selection::Axis::Center;

  vector<GLubyte> Xcolor(4), Ycolor(4), Zcolor(4), Ccolor(4);
  IndexToRGB(pickID + 0, Xcolor[0], Xcolor[1], Xcolor[2]);
  IndexToRGB(pickID + 1, Ycolor[0], Ycolor[1], Ycolor[2]);
  IndexToRGB(pickID + 2, Zcolor[0], Zcolor[1], Zcolor[2]);
  IndexToRGB(pickID + 3, Ccolor[0], Ccolor[1], Ccolor[2]);
  Xcolor[3] = Ycolor[3] = Zcolor[3] = Ccolor[3] = 64;

  axisColors.resize(4);
  axisColors[0] = Xcolor;
  axisColors[1] = Ycolor;
  axisColors[2] = Zcolor;
  axisColors[3] = Ccolor;

  glPushMatrix();

  switch (mode) {
    case Mode::Translate:
      drawTranslateHandles();
      break;
    case Mode::Rotate:
      drawRotateHandles();
      break;
    case Mode::Scale:
      drawScaleHandles();
      break;
    default:
      break;
  }
  glPopMatrix();

  pickID += 4;
}